

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_XmlModelSerialiser::validateXmlOutput(tst_XmlModelSerialiser *this)

{
  undefined8 *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  QXmlStreamReader xmlReader;
  QByteArray modelData;
  XmlModelSerialiser serialiser;
  
  iVar4 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar1 = (undefined8 *)QTest::qData("sourceModel",iVar4);
  modelData.d.d = (Data *)0x0;
  modelData.d.ptr = (char *)0x0;
  modelData.d.size = 0;
  XmlModelSerialiser::XmlModelSerialiser(&serialiser,(QAbstractItemModel *)*puVar1,(QObject *)0x0);
  XmlModelSerialiser::saveModel((QByteArray *)&serialiser);
  QXmlStreamReader::QXmlStreamReader(&xmlReader,&modelData);
  while( true ) {
    cVar2 = QXmlStreamReader::atEnd();
    if (cVar2 != '\0') break;
    QXmlStreamReader::readNext();
  }
  bVar3 = QXmlStreamReader::hasError(&xmlReader);
  QTest::qVerify(!bVar3,"!xmlReader.hasError()","",
                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                 ,0x62);
  QXmlStreamReader::~QXmlStreamReader(&xmlReader);
  XmlModelSerialiser::~XmlModelSerialiser(&serialiser);
  QArrayDataPointer<char>::~QArrayDataPointer(&modelData.d);
  return;
}

Assistant:

void tst_XmlModelSerialiser::validateXmlOutput()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QByteArray modelData;
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.saveModel(&modelData);
    QXmlStreamReader xmlReader(modelData);
    while (!xmlReader.atEnd())
        xmlReader.readNext();
    QVERIFY(!xmlReader.hasError());
}